

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3InsertBuiltinFuncs(FuncDef *aDef,int nDef)

{
  char *z;
  int iVar1;
  FuncDef *pFVar2;
  FuncDef **ppFVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar5 = 0;
  if (0 < nDef) {
    uVar5 = (ulong)(uint)nDef;
  }
  while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
    z = aDef->zName;
    iVar1 = sqlite3Strlen30(z);
    iVar1 = (iVar1 + *z) % 0x17;
    pFVar2 = functionSearch(iVar1,z);
    if (pFVar2 == (FuncDef *)0x0) {
      aDef->pNext = (FuncDef *)0x0;
      ppFVar3 = sqlite3BuiltinFunctions.a + iVar1;
      lVar4 = 0x30;
    }
    else {
      ppFVar3 = &pFVar2->pNext;
      lVar4 = 0x10;
    }
    *(FuncDef **)(&aDef->nArg + lVar4) = *ppFVar3;
    *ppFVar3 = aDef;
    aDef = aDef + 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3InsertBuiltinFuncs(
  FuncDef *aDef,      /* List of global functions to be inserted */
  int nDef            /* Length of the apDef[] list */
){
  int i;
  for(i=0; i<nDef; i++){
    FuncDef *pOther;
    const char *zName = aDef[i].zName;
    int nName = sqlite3Strlen30(zName);
    int h = (zName[0] + nName) % SQLITE_FUNC_HASH_SZ;
    assert( zName[0]>='a' && zName[0]<='z' );
    pOther = functionSearch(h, zName);
    if( pOther ){
      assert( pOther!=&aDef[i] && pOther->pNext!=&aDef[i] );
      aDef[i].pNext = pOther->pNext;
      pOther->pNext = &aDef[i];
    }else{
      aDef[i].pNext = 0;
      aDef[i].u.pHash = sqlite3BuiltinFunctions.a[h];
      sqlite3BuiltinFunctions.a[h] = &aDef[i];
    }
  }
}